

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O2

double AccumulateLSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *puVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar9 = 0;
  uVar7 = 0;
  if (0 < w) {
    uVar7 = (ulong)(uint)w;
  }
  uVar4 = 0;
  if (0 < h) {
    uVar4 = (ulong)(uint)h;
  }
  dVar12 = 0.0;
  while( true ) {
    uVar8 = 2;
    if (2 < (int)uVar9) {
      uVar8 = uVar9 & 0xffffffff;
    }
    if (uVar9 == uVar4) break;
    iVar1 = (int)uVar9 + 3;
    if (h <= iVar1) {
      iVar1 = h;
    }
    uVar5 = 0;
    while( true ) {
      uVar6 = 2;
      if (2 < (int)uVar5) {
        uVar6 = uVar5 & 0xffffffff;
      }
      if (uVar5 == uVar7) break;
      iVar2 = (int)uVar5 + 3;
      if (w <= iVar2) {
        iVar2 = w;
      }
      dVar13 = 65025.0;
      puVar11 = src + (long)src_stride * (uVar8 - 2);
      for (lVar10 = uVar8 - 2; lVar3 = uVar6 - 2, lVar10 < iVar1; lVar10 = lVar10 + 1) {
        for (; lVar3 < iVar2; lVar3 = lVar3 + 1) {
          dVar14 = ((double)puVar11[lVar3] - (double)ref[uVar5 + uVar9 * (long)ref_stride]) *
                   ((double)puVar11[lVar3] - (double)ref[uVar5 + uVar9 * (long)ref_stride]);
          if (dVar13 <= dVar14) {
            dVar14 = dVar13;
          }
          dVar13 = dVar14;
        }
        puVar11 = puVar11 + src_stride;
      }
      dVar12 = dVar12 + dVar13;
      uVar5 = uVar5 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  return dVar12;
}

Assistant:

static double AccumulateLSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  int x, y;
  double total_sse = 0.;
  for (y = 0; y < h; ++y) {
    const int y_0 = (y - RADIUS < 0) ? 0 : y - RADIUS;
    const int y_1 = (y + RADIUS + 1 >= h) ? h : y + RADIUS + 1;
    for (x = 0; x < w; ++x) {
      const int x_0 = (x - RADIUS < 0) ? 0 : x - RADIUS;
      const int x_1 = (x + RADIUS + 1 >= w) ? w : x + RADIUS + 1;
      double best_sse = 255. * 255.;
      const double value = (double)ref[y * ref_stride + x];
      int i, j;
      for (j = y_0; j < y_1; ++j) {
        const uint8_t* const s = src + j * src_stride;
        for (i = x_0; i < x_1; ++i) {
          const double diff = s[i] - value;
          const double sse = diff * diff;
          if (sse < best_sse) best_sse = sse;
        }
      }
      total_sse += best_sse;
    }
  }
  return total_sse;
}